

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::CommitVkVertexBuffers(DeviceContextVkImpl *this)

{
  uint uVar1;
  long lVar2;
  Uint32 UVar3;
  PipelineStateVkImpl *pPVar4;
  PipelineStateDesc *Args_1;
  Char *Message;
  RefCntAutoPtr *this_00;
  BufferVkImpl *pBVar5;
  BufferDesc *pBVar6;
  VkBuffer pVVar7;
  size_t sVar8;
  BufferVkImpl *pBufferVk;
  VertexStreamInfo<Diligent::BufferVkImpl> *CurrStream;
  byte local_255;
  Uint32 slot;
  bool DynamicBufferPresent;
  undefined1 local_248 [8];
  string msg;
  VkDeviceSize Offsets [32];
  VkBuffer vkVertexBuffers [32];
  DeviceContextVkImpl *this_local;
  
  uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
  pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  UVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                    (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  if (uVar1 < UVar3) {
    pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    Args_1 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                       (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    vkVertexBuffers[0x1f]._4_4_ =
         PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
                   (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    LogError<false,char[33],char_const*,char[11],unsigned_int,char[31],unsigned_int,char[10]>
              (false,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x277,(char (*) [33])"Currently bound pipeline state \'",(char **)Args_1,
               (char (*) [11])"\' expects ",(uint *)((long)vkVertexBuffers + 0xfc),
               (char (*) [31])" input buffer slots, but only ",
               &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams,
               (char (*) [10])0xc0e47e);
  }
  if (0x20 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams) {
    FormatString<char[31]>((string *)local_248,(char (*) [31])"Too many buffers are being set");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CommitVkVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x27c);
    std::__cxx11::string::~string((string *)local_248);
  }
  local_255 = 0;
  for (CurrStream._4_4_ = 0;
      CurrStream._4_4_ <
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams;
      CurrStream._4_4_ = CurrStream._4_4_ + 1) {
    this_00 = (RefCntAutoPtr *)
              ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_VertexStreams +
              CurrStream._4_4_);
    pBVar5 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_(this_00);
    if (pBVar5 == (BufferVkImpl *)0x0) {
      pBVar5 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator->(&this->m_DummyVB);
      pVVar7 = BufferVkImpl::GetVkBuffer(pBVar5);
      Offsets[(ulong)CurrStream._4_4_ + 0x1f] = (VkDeviceSize)pVVar7;
      Offsets[(ulong)CurrStream._4_4_ - 1] = 0;
    }
    else {
      pBVar6 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)pBVar5);
      if (pBVar6->Usage == USAGE_DYNAMIC) {
        local_255 = 1;
        DvpVerifyDynamicAllocation(this,pBVar5);
      }
      pVVar7 = BufferVkImpl::GetVkBuffer(pBVar5);
      Offsets[(ulong)CurrStream._4_4_ + 0x1f] = (VkDeviceSize)pVVar7;
      lVar2 = *(long *)(this_00 + 8);
      sVar8 = GetDynamicBufferOffset(this,pBVar5,true);
      Offsets[(ulong)CurrStream._4_4_ - 1] = lVar2 + sVar8;
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams != 0) {
    VulkanUtilities::VulkanCommandBuffer::BindVertexBuffers
              (&this->m_CommandBuffer,0,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumVertexStreams,
               (VkBuffer *)(Offsets + 0x1f),(VkDeviceSize *)(msg.field_2._M_local_buf + 8));
  }
  (this->m_State).CommittedVBsUpToDate = (bool)((local_255 ^ 0xff) & 1);
  return;
}

Assistant:

void DeviceContextVkImpl::CommitVkVertexBuffers()
{
#ifdef DILIGENT_DEVELOPMENT
    if (m_NumVertexStreams < m_pPipelineState->GetNumBufferSlotsUsed())
        LOG_ERROR("Currently bound pipeline state '", m_pPipelineState->GetDesc().Name, "' expects ", m_pPipelineState->GetNumBufferSlotsUsed(), " input buffer slots, but only ", m_NumVertexStreams, " is bound");
#endif
    // Do not initialize array with zeros for performance reasons
    VkBuffer     vkVertexBuffers[MAX_BUFFER_SLOTS]; // = {}
    VkDeviceSize Offsets[MAX_BUFFER_SLOTS];
    VERIFY(m_NumVertexStreams <= MAX_BUFFER_SLOTS, "Too many buffers are being set");
    bool DynamicBufferPresent = false;
    for (Uint32 slot = 0; slot < m_NumVertexStreams; ++slot)
    {
        VertexStreamInfo<BufferVkImpl>& CurrStream = m_VertexStreams[slot];
        if (BufferVkImpl* pBufferVk = CurrStream.pBuffer)
        {
            if (pBufferVk->GetDesc().Usage == USAGE_DYNAMIC)
            {
                DynamicBufferPresent = true;
#ifdef DILIGENT_DEVELOPMENT
                DvpVerifyDynamicAllocation(pBufferVk);
#endif
            }

            // Device context keeps strong references to all vertex buffers.

            vkVertexBuffers[slot] = pBufferVk->GetVkBuffer();
            Offsets[slot]         = CurrStream.Offset + GetDynamicBufferOffset(pBufferVk);
        }
        else
        {
            // We can't bind null vertex buffer in Vulkan and have to use a dummy one
            vkVertexBuffers[slot] = m_DummyVB->GetVkBuffer();
            Offsets[slot]         = 0;
        }
    }

    //GraphCtx.FlushResourceBarriers();
    if (m_NumVertexStreams > 0)
        m_CommandBuffer.BindVertexBuffers(0, m_NumVertexStreams, vkVertexBuffers, Offsets);

    // GPU offset for a dynamic vertex buffer can change every time a draw command is invoked
    m_State.CommittedVBsUpToDate = !DynamicBufferPresent;
}